

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool re2::RE2::Replace(string *str,RE2 *re,StringPiece *rewrite)

{
  bool bVar1;
  int iVar2;
  iterator pcVar3;
  iterator pcVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  StringPiece *local_188;
  string local_170 [8];
  string s;
  StringPiece local_150;
  int local_13c;
  undefined1 local_138 [4];
  int nvec;
  StringPiece vec [17];
  StringPiece *rewrite_local;
  RE2 *re_local;
  string *str_local;
  
  local_188 = (StringPiece *)local_138;
  vec[0x10]._8_8_ = rewrite;
  do {
    StringPiece::StringPiece(local_188);
    local_188 = local_188 + 1;
  } while (local_188 != (StringPiece *)&vec[0x10].length_);
  local_13c = MaxSubmatch((StringPiece *)vec[0x10]._8_8_);
  local_13c = local_13c + 1;
  if (local_13c < 0x12) {
    StringPiece::StringPiece(&local_150,str);
    iVar2 = std::__cxx11::string::size();
    bVar1 = Match(re,&local_150,0,iVar2,UNANCHORED,(StringPiece *)local_138,local_13c);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::__cxx11::string::string(local_170);
      bVar1 = Rewrite(re,(string *)local_170,(StringPiece *)vec[0x10]._8_8_,(StringPiece *)local_138
                      ,local_13c);
      if (bVar1) {
        pcVar3 = StringPiece::begin((StringPiece *)local_138);
        pcVar4 = (iterator)std::__cxx11::string::data();
        if (pcVar3 < pcVar4) {
          __assert_fail("vec[0].begin() >= str->data()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                        ,0x177,
                        "static bool re2::RE2::Replace(string *, const RE2 &, const StringPiece &)")
          ;
        }
        pcVar3 = StringPiece::end((StringPiece *)local_138);
        lVar5 = std::__cxx11::string::data();
        lVar6 = std::__cxx11::string::size();
        if ((iterator)(lVar5 + lVar6) < pcVar3) {
          __assert_fail("vec[0].end() <= str->data()+str->size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                        ,0x178,
                        "static bool re2::RE2::Replace(string *, const RE2 &, const StringPiece &)")
          ;
        }
        pcVar7 = StringPiece::data((StringPiece *)local_138);
        lVar5 = std::__cxx11::string::data();
        iVar2 = StringPiece::size((StringPiece *)local_138);
        std::__cxx11::string::replace((ulong)str,(long)pcVar7 - lVar5,(string *)(long)iVar2);
        str_local._7_1_ = true;
      }
      else {
        str_local._7_1_ = false;
      }
      std::__cxx11::string::~string(local_170);
    }
    else {
      str_local._7_1_ = false;
    }
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

bool RE2::Replace(string *str,
                 const RE2& re,
                 const StringPiece& rewrite) {
  StringPiece vec[kVecSize];
  int nvec = 1 + MaxSubmatch(rewrite);
  if (nvec > arraysize(vec))
    return false;
  if (!re.Match(*str, 0, static_cast<int>(str->size()), UNANCHORED, vec, nvec))
    return false;

  string s;
  if (!re.Rewrite(&s, rewrite, vec, nvec))
    return false;

  assert(vec[0].begin() >= str->data());
  assert(vec[0].end() <= str->data()+str->size());
  str->replace(vec[0].data() - str->data(), vec[0].size(), s);
  return true;
}